

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

int32 keycmp_nocase(hash_entry_t *entry,char *key)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  char cVar4;
  
  if (entry->len != 0) {
    sVar2 = 0;
    do {
      cVar1 = entry->key[sVar2];
      cVar3 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar3 = cVar1;
      }
      cVar1 = key[sVar2];
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = cVar1;
      }
      if (cVar3 != cVar4) {
        return (int)cVar3 - (int)cVar4;
      }
      sVar2 = sVar2 + 1;
    } while (entry->len != sVar2);
  }
  return 0;
}

Assistant:

static int32
keycmp_nocase(hash_entry_t * entry, const char *key)
{
    char c1, c2;
    int32 i;
    const char *str;

    str = entry->key;
    for (i = 0; (uint32)i < entry->len; i++) {
        c1 = *(str++);
        c1 = UPPER_CASE(c1);
        c2 = *(key++);
        c2 = UPPER_CASE(c2);
        if (c1 != c2)
            return (c1 - c2);
    }

    return 0;
}